

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void safefree(void *ptr)

{
  if (ptr == (void *)0x0) {
    return;
  }
  free(ptr);
  return;
}

Assistant:

void safefree(void *ptr)
{
    if (ptr) {
#ifdef MINEFIELD
        minefield_c_free(ptr);
#else
        free(ptr);
#endif
    }
}